

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  char cVar1;
  connectdata *conn;
  FILEPROTO *pFVar2;
  long lVar3;
  long lVar4;
  timediff_t tVar5;
  bool bVar6;
  CURLcode CVar7;
  CURLcode CVar8;
  uint uVar9;
  char *pcVar10;
  size_t sVar11;
  curl_slist *pcVar12;
  curltime cVar13;
  char *rawPath;
  int local_5c;
  ftp_conn *local_58;
  size_t local_50;
  int ftpcode;
  ssize_t nread;
  ssize_t nread_1;
  
  conn = data->conn;
  pFVar2 = (data->req).p.file;
  rawPath = (char *)0x0;
  local_50 = 0;
  if (pFVar2 == (FILEPROTO *)0x0) {
    return CURLE_OK;
  }
  if ((((CURLE_FILESIZE_EXCEEDED < status) ||
       ((0x80000010428e3601U >> ((ulong)status & 0x3f) & 1) == 0)) &&
      (status != CURLE_REMOTE_FILE_NOT_FOUND)) || (CVar7 = CURLE_OK, premature)) {
    (conn->proto).ftpc.ctl_valid = false;
    (conn->proto).ftpc.cwdfail = true;
    Curl_conncontrol(conn,1);
    CVar7 = status;
  }
  if (((data->state).field_0x6d0 & 0x40) != 0) {
    if (((data->set).chunk_end != (curl_chunk_end_callback)0x0) &&
       ((conn->proto).ftpc.file != (char *)0x0)) {
      Curl_set_in_callback(data,true);
      (*(data->set).chunk_end)((data->wildcard).customptr);
      Curl_set_in_callback(data,false);
    }
    (conn->proto).ftpc.known_filesize = -1;
  }
  local_58 = (ftp_conn *)&conn->proto;
  if ((CVar7 == CURLE_OK) &&
     (CVar7 = Curl_urldecode(pFVar2->path,0,&rawPath,&local_50,REJECT_CTRL), CVar7 == CURLE_OK)) {
    if (((data->set).ftp_filemethod == '\x02') && (*rawPath == '/')) {
      (*Curl_cfree)(rawPath);
      pcVar10 = (conn->proto).ftpc.prevpath;
    }
    else {
      (*Curl_cfree)((conn->proto).ftpc.prevpath);
      if ((conn->proto).ftpc.cwdfail != false) {
        (*Curl_cfree)(rawPath);
        (conn->proto).ftpc.prevpath = (char *)0x0;
        CVar7 = CURLE_OK;
        bVar6 = true;
        goto LAB_004b123f;
      }
      if ((data->set).ftp_filemethod == '\x02') {
        local_50 = 0;
      }
      else {
        pcVar10 = (conn->proto).ftpc.file;
        if (pcVar10 == (char *)0x0) {
          sVar11 = 0;
        }
        else {
          sVar11 = strlen(pcVar10);
        }
        local_50 = local_50 - sVar11;
      }
      rawPath[local_50] = '\0';
      (conn->proto).ftpc.prevpath = rawPath;
      pcVar10 = rawPath;
    }
    bVar6 = true;
    if (pcVar10 == (char *)0x0) {
      CVar7 = CURLE_OK;
    }
    else {
      CVar7 = CURLE_OK;
      Curl_infof(data,"Remembering we are in dir \"%s\"");
    }
  }
  else {
    (conn->proto).ftpc.ctl_valid = false;
    Curl_conncontrol(conn,1);
    (*Curl_cfree)((conn->proto).ftpc.prevpath);
    (conn->proto).ftpc.prevpath = (char *)0x0;
    bVar6 = false;
  }
LAB_004b123f:
  freedirs(local_58);
  if (conn->sock[1] != -1) {
    if (((bVar6) && (CVar7 = CURLE_OK, (conn->proto).ftpc.dont_check == true)) &&
       (0 < (data->req).maxdownload)) {
      CVar8 = Curl_pp_sendf(data,&local_58->pp,"%s","ABOR");
      CVar7 = CURLE_OK;
      if (CVar8 != CURLE_OK) {
        pcVar10 = curl_easy_strerror(CVar8);
        Curl_failf(data,"Failure sending ABOR command: %s",pcVar10);
        (conn->proto).ftpc.ctl_valid = false;
        Curl_conncontrol(conn,1);
        CVar7 = CVar8;
      }
    }
    if ((conn->ssl[1].field_0x10 & 1) != 0) {
      Curl_ssl_close(data,conn,1);
    }
    close_secondarysocket(data,conn);
  }
  if (CVar7 != CURLE_OK) goto LAB_004b1320;
  if (((pFVar2->fd != 0) || ((conn->proto).ftpc.ctl_valid != true)) ||
     ((conn->proto).httpc.binsettings[0x20] != '\x01' || premature)) goto LAB_004b1314;
  tVar5 = (conn->proto).ftpc.pp.response_time;
  (conn->proto).ftpc.pp.response_time = 60000;
  cVar13 = Curl_now();
  (conn->proto).smbc.send_size = cVar13.tv_sec;
  *(int *)((long)&conn->proto + 0x48) = cVar13.tv_usec;
  CVar7 = Curl_GetFTPResponse(data,&nread,&ftpcode);
  (conn->proto).ftpc.pp.response_time = tVar5;
  if (CVar7 == CURLE_OPERATION_TIMEDOUT && nread == 0) {
    Curl_failf(data,"control connection looks dead");
    (conn->proto).ftpc.ctl_valid = false;
    Curl_conncontrol(conn,1);
    goto LAB_004b1604;
  }
  if (CVar7 != CURLE_OK) goto LAB_004b1604;
  if ((conn->proto).ftpc.dont_check != true) {
    if ((ftpcode == 0xe2) || (ftpcode == 0xfa)) goto LAB_004b1314;
    if (ftpcode == 0x228) {
      Curl_failf(data,"Exceeded storage allocation");
      CVar7 = CURLE_REMOTE_DISK_FULL;
      goto LAB_004b1320;
    }
    Curl_failf(data,"server did not report OK, got %d");
    goto LAB_004b168b;
  }
  if (0 < (data->req).maxdownload) {
    Curl_infof(data,"partial download completed, closing connection");
    Curl_conncontrol(conn,1);
    return CURLE_OK;
  }
LAB_004b1314:
  CVar7 = CURLE_OK;
  CVar8 = CURLE_OK;
  if (!premature) {
    uVar9 = (uint)*(undefined8 *)&(data->set).field_0x8e2;
    if ((uVar9 >> 0x1a & 1) == 0) {
      lVar3 = (data->req).size;
      if (((lVar3 == -1) || (lVar4 = (data->req).bytecount, lVar3 == lVar4)) ||
         (((data->state).crlf_conversions + lVar3 == lVar4 || ((data->req).maxdownload == lVar4))))
      {
        if ((((conn->proto).ftpc.dont_check == false) && (0 < lVar3)) &&
           (CVar7 = CVar8, (data->req).bytecount == 0)) {
          Curl_failf(data,"No data was received");
          CVar7 = CURLE_FTP_COULDNT_RETR_FILE;
        }
      }
      else {
        Curl_failf(data,"Received only partial file: %ld bytes");
LAB_004b168b:
        CVar7 = CURLE_PARTIAL_FILE;
      }
    }
    else {
      lVar3 = (data->state).infilesize;
      CVar7 = CVar8;
      if (((lVar3 != -1) &&
          ((char)((uVar9 & 8) >> 3) == '\0' && lVar3 != (data->req).writebytecount)) &&
         (pFVar2->fd == 0)) {
        Curl_failf(data,"Uploaded unaligned file size (%ld out of %ld bytes)");
        goto LAB_004b168b;
      }
    }
  }
LAB_004b1320:
  pFVar2->fd = 0;
  (conn->proto).ftpc.dont_check = false;
  if ((status == CURLE_OK && CVar7 == CURLE_OK) && !premature) {
    pcVar12 = (data->set).postquote;
    CVar7 = CURLE_OK;
    if (pcVar12 != (curl_slist *)0x0) {
      for (; CVar7 = CURLE_OK, pcVar12 != (curl_slist *)0x0; pcVar12 = pcVar12->next) {
        pcVar10 = pcVar12->data;
        if (pcVar10 != (char *)0x0) {
          local_5c = 0;
          cVar1 = *pcVar10;
          CVar7 = Curl_pp_sendf(data,&local_58->pp,"%s",pcVar10 + (cVar1 == '*'));
          if (CVar7 != CURLE_OK) break;
          cVar13 = Curl_now();
          (conn->proto).smbc.send_size = cVar13.tv_sec;
          *(int *)((long)&conn->proto + 0x48) = cVar13.tv_usec;
          CVar7 = Curl_GetFTPResponse(data,&nread_1,&local_5c);
          if (CVar7 != CURLE_OK) break;
          if ((cVar1 != '*') && (399 < local_5c)) {
            Curl_failf(data,"QUOT string not accepted: %s",pcVar10);
            CVar7 = CURLE_QUOTE_ERROR;
            break;
          }
        }
      }
    }
  }
LAB_004b1604:
  (*Curl_cfree)(pFVar2->freepath);
  pFVar2->freepath = (char *)0x0;
  return CVar7;
}

Assistant:

static CURLcode ftp_done(struct Curl_easy *data, CURLcode status,
                         bool premature)
{
  struct connectdata *conn = data->conn;
  struct FTP *ftp = data->req.p.ftp;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  ssize_t nread;
  int ftpcode;
  CURLcode result = CURLE_OK;
  char *rawPath = NULL;
  size_t pathLen = 0;

  if(!ftp)
    return CURLE_OK;

  switch(status) {
  case CURLE_BAD_DOWNLOAD_RESUME:
  case CURLE_FTP_WEIRD_PASV_REPLY:
  case CURLE_FTP_PORT_FAILED:
  case CURLE_FTP_ACCEPT_FAILED:
  case CURLE_FTP_ACCEPT_TIMEOUT:
  case CURLE_FTP_COULDNT_SET_TYPE:
  case CURLE_FTP_COULDNT_RETR_FILE:
  case CURLE_PARTIAL_FILE:
  case CURLE_UPLOAD_FAILED:
  case CURLE_REMOTE_ACCESS_DENIED:
  case CURLE_FILESIZE_EXCEEDED:
  case CURLE_REMOTE_FILE_NOT_FOUND:
  case CURLE_WRITE_ERROR:
    /* the connection stays alive fine even though this happened */
    /* fall-through */
  case CURLE_OK: /* doesn't affect the control connection's status */
    if(!premature)
      break;

    /* until we cope better with prematurely ended requests, let them
     * fallback as if in complete failure */
    /* FALLTHROUGH */
  default:       /* by default, an error means the control connection is
                    wedged and should not be used anymore */
    ftpc->ctl_valid = FALSE;
    ftpc->cwdfail = TRUE; /* set this TRUE to prevent us to remember the
                             current path, as this connection is going */
    connclose(conn, "FTP ended with bad error code");
    result = status;      /* use the already set error code */
    break;
  }

  if(data->state.wildcardmatch) {
    if(data->set.chunk_end && ftpc->file) {
      Curl_set_in_callback(data, true);
      data->set.chunk_end(data->wildcard.customptr);
      Curl_set_in_callback(data, false);
    }
    ftpc->known_filesize = -1;
  }

  if(!result)
    /* get the url-decoded "raw" path */
    result = Curl_urldecode(ftp->path, 0, &rawPath, &pathLen,
                            REJECT_CTRL);
  if(result) {
    /* We can limp along anyway (and should try to since we may already be in
     * the error path) */
    ftpc->ctl_valid = FALSE; /* mark control connection as bad */
    connclose(conn, "FTP: out of memory!"); /* mark for connection closure */
    free(ftpc->prevpath);
    ftpc->prevpath = NULL; /* no path remembering */
  }
  else { /* remember working directory for connection reuse */
    if((data->set.ftp_filemethod == FTPFILE_NOCWD) && (rawPath[0] == '/'))
      free(rawPath); /* full path => no CWDs happened => keep ftpc->prevpath */
    else {
      free(ftpc->prevpath);

      if(!ftpc->cwdfail) {
        if(data->set.ftp_filemethod == FTPFILE_NOCWD)
          pathLen = 0; /* relative path => working directory is FTP home */
        else
          pathLen -= ftpc->file?strlen(ftpc->file):0; /* file is url-decoded */

        rawPath[pathLen] = '\0';
        ftpc->prevpath = rawPath;
      }
      else {
        free(rawPath);
        ftpc->prevpath = NULL; /* no path */
      }
    }

    if(ftpc->prevpath)
      infof(data, "Remembering we are in dir \"%s\"", ftpc->prevpath);
  }

  /* free the dir tree and file parts */
  freedirs(ftpc);

  /* shut down the socket to inform the server we're done */

#ifdef _WIN32_WCE
  shutdown(conn->sock[SECONDARYSOCKET], 2);  /* SD_BOTH */
#endif

  if(conn->sock[SECONDARYSOCKET] != CURL_SOCKET_BAD) {
    if(!result && ftpc->dont_check && data->req.maxdownload > 0) {
      /* partial download completed */
      result = Curl_pp_sendf(data, pp, "%s", "ABOR");
      if(result) {
        failf(data, "Failure sending ABOR command: %s",
              curl_easy_strerror(result));
        ftpc->ctl_valid = FALSE; /* mark control connection as bad */
        connclose(conn, "ABOR command failed"); /* connection closure */
      }
    }

    if(conn->ssl[SECONDARYSOCKET].use) {
      /* The secondary socket is using SSL so we must close down that part
         first before we close the socket for real */
      Curl_ssl_close(data, conn, SECONDARYSOCKET);

      /* Note that we keep "use" set to TRUE since that (next) connection is
         still requested to use SSL */
    }
    close_secondarysocket(data, conn);
  }

  if(!result && (ftp->transfer == PPTRANSFER_BODY) && ftpc->ctl_valid &&
     pp->pending_resp && !premature) {
    /*
     * Let's see what the server says about the transfer we just performed,
     * but lower the timeout as sometimes this connection has died while the
     * data has been transferred. This happens when doing through NATs etc that
     * abandon old silent connections.
     */
    timediff_t old_time = pp->response_time;

    pp->response_time = 60*1000; /* give it only a minute for now */
    pp->response = Curl_now(); /* timeout relative now */

    result = Curl_GetFTPResponse(data, &nread, &ftpcode);

    pp->response_time = old_time; /* set this back to previous value */

    if(!nread && (CURLE_OPERATION_TIMEDOUT == result)) {
      failf(data, "control connection looks dead");
      ftpc->ctl_valid = FALSE; /* mark control connection as bad */
      connclose(conn, "Timeout or similar in FTP DONE operation"); /* close */
    }

    if(result) {
      Curl_safefree(ftp->pathalloc);
      return result;
    }

    if(ftpc->dont_check && data->req.maxdownload > 0) {
      /* we have just sent ABOR and there is no reliable way to check if it was
       * successful or not; we have to close the connection now */
      infof(data, "partial download completed, closing connection");
      connclose(conn, "Partial download with no ability to check");
      return result;
    }

    if(!ftpc->dont_check) {
      /* 226 Transfer complete, 250 Requested file action okay, completed. */
      switch(ftpcode) {
      case 226:
      case 250:
        break;
      case 552:
        failf(data, "Exceeded storage allocation");
        result = CURLE_REMOTE_DISK_FULL;
        break;
      default:
        failf(data, "server did not report OK, got %d", ftpcode);
        result = CURLE_PARTIAL_FILE;
        break;
      }
    }
  }

  if(result || premature)
    /* the response code from the transfer showed an error already so no
       use checking further */
    ;
  else if(data->set.upload) {
    if((-1 != data->state.infilesize) &&
       (data->state.infilesize != data->req.writebytecount) &&
       !data->set.crlf &&
       (ftp->transfer == PPTRANSFER_BODY)) {
      failf(data, "Uploaded unaligned file size (%" CURL_FORMAT_CURL_OFF_T
            " out of %" CURL_FORMAT_CURL_OFF_T " bytes)",
            data->req.writebytecount, data->state.infilesize);
      result = CURLE_PARTIAL_FILE;
    }
  }
  else {
    if((-1 != data->req.size) &&
       (data->req.size != data->req.bytecount) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs, so
        * we'll check to see if the discrepancy can be explained by the number
        * of CRLFs we've changed to LFs.
        */
       ((data->req.size + data->state.crlf_conversions) !=
        data->req.bytecount) &&
#endif /* CURL_DO_LINEEND_CONV */
       (data->req.maxdownload != data->req.bytecount)) {
      failf(data, "Received only partial file: %" CURL_FORMAT_CURL_OFF_T
            " bytes", data->req.bytecount);
      result = CURLE_PARTIAL_FILE;
    }
    else if(!ftpc->dont_check &&
            !data->req.bytecount &&
            (data->req.size>0)) {
      failf(data, "No data was received");
      result = CURLE_FTP_COULDNT_RETR_FILE;
    }
  }

  /* clear these for next connection */
  ftp->transfer = PPTRANSFER_BODY;
  ftpc->dont_check = FALSE;

  /* Send any post-transfer QUOTE strings? */
  if(!status && !result && !premature && data->set.postquote)
    result = ftp_sendquote(data, conn, data->set.postquote);
  Curl_safefree(ftp->pathalloc);
  return result;
}